

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void hashkey(connectdata *conn,char *buf,size_t len)

{
  long lVar1;
  
  lVar1 = 0x118;
  if ((((conn->bits).socksproxy == false) && (lVar1 = 0x158, (conn->bits).httpproxy == false)) &&
     (lVar1 = 0xd0, (conn->bits).conn_to_host != false)) {
    lVar1 = 0xf8;
  }
  curl_msnprintf(buf,0x80,"%ld%s",conn->port,
                 *(undefined8 *)((conn->chunk).hexbuffer + lVar1 + -0x20));
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len) /* something like 128 is fine */
{
  const char *hostname;

  if(conn->bits.socksproxy)
    hostname = conn->socks_proxy.host.name;
  else if(conn->bits.httpproxy)
    hostname = conn->http_proxy.host.name;
  else if(conn->bits.conn_to_host)
    hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  DEBUGASSERT(len > 32);

  /* put the number first so that the hostname gets cut off if too long */
  snprintf(buf, len, "%ld%s", conn->port, hostname);
}